

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprLexer.cxx
# Opt level: O0

int yy_get_next_buffer(yyscan_t yyscanner)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  int new_size_1;
  int new_size;
  int yy_c_buf_p_offset;
  YY_BUFFER_STATE b;
  int num_to_read;
  int ret_val;
  int i;
  int number_to_move;
  char *source;
  char *dest;
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  
  if ((ulong)(*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                 *(long *)((long)yyscanner + 0x18) * 8) + 8) +
             (long)(*(int *)((long)yyscanner + 0x34) + 1)) < *(ulong *)((long)yyscanner + 0x40)) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed",yyscanner);
  }
  if (*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
              + 0x34) == 0) {
    if (*(long *)((long)yyscanner + 0x40) - *(long *)((long)yyscanner + 0x80) == 1) {
      yyscanner_local._4_4_ = 1;
    }
    else {
      yyscanner_local._4_4_ = 2;
    }
  }
  else {
    iVar4 = ((int)*(undefined8 *)((long)yyscanner + 0x40) -
            (int)*(undefined8 *)((long)yyscanner + 0x80)) + -1;
    _i = *(char **)((long)yyscanner + 0x80);
    source = *(char **)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                 *(long *)((long)yyscanner + 0x18) * 8) + 8);
    for (num_to_read = 0; num_to_read < iVar4; num_to_read = num_to_read + 1) {
      *source = *_i;
      _i = _i + 1;
      source = source + 1;
    }
    if (*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          ) + 0x38) == 2) {
      *(undefined4 *)((long)yyscanner + 0x34) = 0;
      *(undefined4 *)
       (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 0x1c)
           = 0;
    }
    else {
      iVar5 = *(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                *(long *)((long)yyscanner + 0x18) * 8) + 0x18) - iVar4;
      while (b._0_4_ = iVar5 + -1, (int)b < 1) {
        lVar1 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
        ;
        uVar2 = *(undefined8 *)((long)yyscanner + 0x40);
        uVar3 = *(undefined8 *)(lVar1 + 8);
        if (*(int *)(lVar1 + 0x20) == 0) {
          *(undefined8 *)(lVar1 + 8) = 0;
        }
        else {
          if (*(int *)(lVar1 + 0x18) << 1 < 1) {
            *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) / 8 + *(int *)(lVar1 + 0x18);
          }
          else {
            *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) << 1;
          }
          pvVar6 = cmCommandArgument_yyrealloc
                             (*(void **)(lVar1 + 8),(long)(*(int *)(lVar1 + 0x18) + 2),yyscanner);
          *(void **)(lVar1 + 8) = pvVar6;
        }
        if (*(long *)(lVar1 + 8) == 0) {
          yy_fatal_error("fatal error - scanner input buffer overflow",yyscanner);
        }
        *(long *)((long)yyscanner + 0x40) = *(long *)(lVar1 + 8) + (long)((int)uVar2 - (int)uVar3);
        iVar5 = *(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                  *(long *)((long)yyscanner + 0x18) * 8) + 0x18) - iVar4;
      }
      if (0x2000 < (int)b) {
        b._0_4_ = 0x2000;
      }
      iVar5 = cmCommandArgumentParserHelper::LexInput
                        (*yyscanner,
                         (char *)(*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                                     *(long *)((long)yyscanner + 0x18) * 8) + 8) +
                                 (long)iVar4),(int)b);
      *(int *)((long)yyscanner + 0x34) = iVar5;
      *(undefined4 *)
       (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 0x1c)
           = *(undefined4 *)((long)yyscanner + 0x34);
    }
    if (*(int *)((long)yyscanner + 0x34) == 0) {
      if (iVar4 == 0) {
        b._4_4_ = 1;
        cmCommandArgument_yyrestart(*(FILE **)((long)yyscanner + 8),yyscanner);
      }
      else {
        b._4_4_ = 2;
        *(undefined4 *)
         (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) +
         0x38) = 2;
      }
    }
    else {
      b._4_4_ = 0;
    }
    if (*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          ) + 0x18) < *(int *)((long)yyscanner + 0x34) + iVar4) {
      iVar5 = *(int *)((long)yyscanner + 0x34) + iVar4 + (*(int *)((long)yyscanner + 0x34) >> 1);
      pvVar6 = cmCommandArgument_yyrealloc
                         (*(void **)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                              *(long *)((long)yyscanner + 0x18) * 8) + 8),
                          (long)iVar5,yyscanner);
      *(void **)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          ) + 8) = pvVar6;
      if (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                             *(long *)((long)yyscanner + 0x18) * 8) + 8) == 0) {
        yy_fatal_error("out of dynamic memory in yy_get_next_buffer()",yyscanner);
      }
      *(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
              + 0x18) = iVar5 + -2;
    }
    *(int *)((long)yyscanner + 0x34) = iVar4 + *(int *)((long)yyscanner + 0x34);
    *(undefined1 *)
     (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
               + 8) + (long)*(int *)((long)yyscanner + 0x34)) = 0;
    *(undefined1 *)
     (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
               + 8) + (long)(*(int *)((long)yyscanner + 0x34) + 1)) = 0;
    *(undefined8 *)((long)yyscanner + 0x80) =
         *(undefined8 *)
          (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 8)
    ;
    yyscanner_local._4_4_ = b._4_4_;
  }
  return yyscanner_local._4_4_;
}

Assistant:

static int yy_get_next_buffer (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = yyg->yytext_ptr;
	int number_to_move, i;
	int ret_val;

	if ( yyg->yy_c_buf_p > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[yyg->yy_n_chars + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( yyg->yy_c_buf_p - yyg->yytext_ptr - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) (yyg->yy_c_buf_p - yyg->yytext_ptr - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) (yyg->yy_c_buf_p - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2) , yyscanner );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			yyg->yy_c_buf_p = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			yyg->yy_n_chars, num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	if ( yyg->yy_n_chars == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  , yyscanner);
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if ((yyg->yy_n_chars + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = yyg->yy_n_chars + number_to_move + (yyg->yy_n_chars >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size , yyscanner );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	yyg->yy_n_chars += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[yyg->yy_n_chars] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[yyg->yy_n_chars + 1] = YY_END_OF_BUFFER_CHAR;

	yyg->yytext_ptr = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}